

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::anon_unknown_160::CompositeInheritsRec
               (uint32_t depth,Layer *layer,PrimSpec *primspec,string *warn,string *err)

{
  pointer pPVar1;
  Path *path;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  PrimSpec *src;
  string *err_00;
  PrimSpec *child;
  pointer primspec_00;
  PrimSpec *inheritPrimSpec;
  ostringstream ss_e;
  PrimSpec *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  if (0x100000 < depth) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"CompositeInheritsRec",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x3bc);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Too deep.",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_138);
    return false;
  }
  primspec_00 = (primspec->_children).
                super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
                super__Vector_impl_data._M_start;
  pPVar1 = (primspec->_children).
           super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
           super__Vector_impl_data._M_finish;
  err_00 = err;
  if (primspec_00 != pPVar1) {
    do {
      err_00 = err;
      bVar2 = CompositeInheritsRec(depth + 1,layer,primspec_00,warn,err);
      if (!bVar2) {
        return false;
      }
      primspec_00 = primspec_00 + 1;
    } while (primspec_00 != pPVar1);
  }
  if ((primspec->_metas).inherits.has_value_ != true) {
    return true;
  }
  path = *(Path **)((long)&(primspec->_metas).inherits.contained + 8);
  lVar4 = (*(long *)((long)&(primspec->_metas).inherits.contained + 0x10) - (long)path >> 4) *
          0x4ec4ec4ec4ec4ec5;
  if (lVar4 == 1) {
    local_1d0 = (PrimSpec *)0x0;
    bVar2 = Layer::find_primspec_at(layer,path,&local_1d0,err);
    if (!bVar2) {
      if (err == (string *)0x0) {
        return false;
      }
      ::std::operator+(&local_1c8,"Inheirt primspec failed since Path <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1c8);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_198 = *plVar6;
        lStack_190 = plVar5[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar6;
        local_1a8 = (long *)*plVar5;
      }
      local_1a0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
        return false;
      }
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      return false;
    }
    if (local_1d0 == (PrimSpec *)0x0) {
      local_1d0 = (PrimSpec *)0x0;
      goto joined_r0x001ad13c;
    }
    bVar2 = InheritPrimSpec((tinyusdz *)primspec,local_1d0,src,err,err_00);
    if (!bVar2) {
      return false;
    }
    if ((primspec->_metas).inherits.has_value_ != true) goto LAB_001ad06e;
  }
  else if (lVar4 != 0) {
joined_r0x001ad13c:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
             ((long)&(primspec->_metas).inherits.contained + 8));
LAB_001ad06e:
  (primspec->_metas).inherits.has_value_ = false;
  return true;
}

Assistant:

bool CompositeInheritsRec(uint32_t depth, const Layer &layer,
                          PrimSpec &primspec /* [inout] */, std::string *warn,
                          std::string *err) {
  if (depth > (1024 * 1024)) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeInheritsRec(depth + 1, layer, child, warn, err)) {
      return false;
    }
  }

  if (primspec.metas().inherits) {
    const auto &qual = primspec.metas().inherits.value().first;
    const auto &inherits = primspec.metas().inherits.value().second;

    if (inherits.size() == 0) {
      // no-op, just remove `inherits` metadataum.
      primspec.metas().inherits.reset();
      return true;
    }

    if (inherits.size() != 1) {
      if (err) {
        (*err) += "Multiple inheritance is not supporetd.\n";
      }
      return false;
    }

    const Path &inheritPath = inherits[0];

    const PrimSpec *inheritPrimSpec{nullptr};

    if (!layer.find_primspec_at(inheritPath, &inheritPrimSpec, err)) {
      if (err) {
        (*err) += "Inheirt primspec failed since Path <" +
                  inheritPath.prim_part() + "> not found or is invalid.\n";
      }

      return false;
    }

    // TODO: listEdit
    DCOUT("TODO: listEdit in `inherits`");
    (void)qual;

    if (inheritPrimSpec) {
      if (!InheritPrimSpec(primspec, *inheritPrimSpec, warn, err)) {
        return false;
      }

      // remove `inherits` metadataum.
      primspec.metas().inherits.reset();

    } else {
      // ???
      if (err) {
        (*err) +=
            "Inernal error. PrimSpec is nullptr in CompositeInehritsRec.\n";
      }
      return false;
    }
  }

  return true;
}